

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O0

int32_t zng_deflateParams(zng_stream *strm,int32_t level,int32_t strategy)

{
  deflate_state *s_00;
  int iVar1;
  int32_t iVar2;
  int in_EDX;
  int in_ESI;
  zng_stream *in_RDI;
  int err;
  int flush;
  int hook_flush;
  compress_func func;
  deflate_state *s;
  int local_14;
  int32_t local_4;
  
  iVar1 = deflateStateCheck(in_RDI);
  if (iVar1 == 0) {
    s_00 = in_RDI->state;
    local_14 = in_ESI;
    if (in_ESI == -1) {
      local_14 = 6;
    }
    if ((((local_14 < 0) || (9 < local_14)) || (in_EDX < 0)) || (4 < in_EDX)) {
      local_4 = -2;
    }
    else {
      if (((in_EDX != s_00->strategy) ||
          (configuration_table[s_00->level].func != configuration_table[local_14].func)) &&
         (s_00->last_flush != -2)) {
        iVar2 = zng_deflate((zng_stream *)s,func._4_4_);
        if (iVar2 == -2) {
          return -2;
        }
        if ((in_RDI->avail_in != 0) || ((s_00->strstart - s_00->block_start) + s_00->lookahead != 0)
           ) {
          return -5;
        }
      }
      if (s_00->level != local_14) {
        if ((s_00->level == 0) && (s_00->matches != 0)) {
          if (s_00->matches == 1) {
            (*functable.slide_hash)(s_00);
          }
          else {
            memset(s_00->head,0,0x20000);
          }
          s_00->matches = 0;
        }
        lm_set_level(s_00,local_14);
      }
      s_00->strategy = in_EDX;
      local_4 = 0;
    }
  }
  else {
    local_4 = -2;
  }
  return local_4;
}

Assistant:

int32_t Z_EXPORT PREFIX(deflateParams)(PREFIX3(stream) *strm, int32_t level, int32_t strategy) {
    deflate_state *s;
    compress_func func;
    int hook_flush = Z_NO_FLUSH;

    if (deflateStateCheck(strm))
        return Z_STREAM_ERROR;
    s = strm->state;

    if (level == Z_DEFAULT_COMPRESSION)
        level = 6;
    if (level < 0 || level > 9 || strategy < 0 || strategy > Z_FIXED)
        return Z_STREAM_ERROR;
    DEFLATE_PARAMS_HOOK(strm, level, strategy, &hook_flush);  /* hook for IBM Z DFLTCC */
    func = configuration_table[s->level].func;

    if (((strategy != s->strategy || func != configuration_table[level].func) && s->last_flush != -2)
        || hook_flush != Z_NO_FLUSH) {
        /* Flush the last buffer. Use Z_BLOCK mode, unless the hook requests a "stronger" one. */
        int flush = RANK(hook_flush) > RANK(Z_BLOCK) ? hook_flush : Z_BLOCK;
        int err = PREFIX(deflate)(strm, flush);
        if (err == Z_STREAM_ERROR)
            return err;
        if (strm->avail_in || ((int)s->strstart - s->block_start) + s->lookahead || !DEFLATE_DONE(strm, flush))
            return Z_BUF_ERROR;
    }
    if (s->level != level) {
        if (s->level == 0 && s->matches != 0) {
            if (s->matches == 1) {
                FUNCTABLE_CALL(slide_hash)(s);
            } else {
                CLEAR_HASH(s);
            }
            s->matches = 0;
        }

        lm_set_level(s, level);
    }
    s->strategy = strategy;
    return Z_OK;
}